

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::BinaryExpressionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((((kind - AddAssignmentExpression < 2) || (kind == AndAssignmentExpression)) ||
         (kind - ArithmeticLeftShiftAssignmentExpression < 4)) ||
        (((kind == AssignmentExpression || (kind == BinaryAndExpression)) ||
         ((kind - BinaryOrExpression < 3 ||
          ((kind == CaseEqualityExpression || (kind == CaseInequalityExpression)))))))) ||
       ((kind - DivideAssignmentExpression < 2 ||
        (((kind == EqualityExpression || (kind - GreaterThanEqualExpression < 2)) ||
         (kind == InequalityExpression)))))) ||
      (((kind - LessThanEqualExpression < 2 || (kind - LogicalAndExpression < 8)) ||
       (((kind - ModAssignmentExpression < 2 ||
         ((kind - MultiplyAssignmentExpression < 2 || (kind == NonblockingAssignmentExpression))))
        || (kind == OrAssignmentExpression)))))) ||
     ((((kind == PowerExpression || (kind - SubtractAssignmentExpression < 2)) ||
       (kind - WildcardEqualityExpression < 2)) || (kind == XorAssignmentExpression)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BinaryExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::AddExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::ModExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::PowerExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::SubtractExpression:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::XorAssignmentExpression:
            return true;
        default:
            return false;
    }
}